

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O3

void __thiscall
JsUtil::
BaseDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
::Resize(BaseDictionary<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::RecyclerWeakReference<Js::DynamicType>_*,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::WeakRefValueDictionaryEntry,_JsUtil::NoResizeLock>
         *this)

{
  code *pcVar1;
  uint newSize;
  Type TVar2;
  bool bVar3;
  uint uVar4;
  undefined4 *puVar5;
  EntryType *dst;
  int *piVar6;
  int iVar7;
  long lVar8;
  long lVar9;
  uint bucketCount;
  Type local_40;
  int *newBuckets;
  
  newSize = this->count * 2;
  bucketCount = 4;
  if (4 < newSize) {
    if ((int)newSize < 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/SizePolicy.h"
                         ,0x32,"(minCapacity_t <= ((int32_t)(((uint32_t)~((uint32_t)0)) >> 1)))",
                         "the next higher power of 2  must fit in uint32");
      if (!bVar3) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar5 = 0;
    }
    else {
      bucketCount = newSize;
      if ((newSize + 0x7fffffff & newSize) == 0) goto LAB_00ccdf7e;
    }
    iVar7 = 0x1f;
    if (newSize != 0) {
      for (; newSize >> iVar7 == 0; iVar7 = iVar7 + -1) {
      }
    }
    bucketCount = 1 << (-((byte)iVar7 ^ 0x1f) & 0x1f);
  }
LAB_00ccdf7e:
  local_40.ptr = (int *)0x0;
  newBuckets = (int *)0x0;
  if (bucketCount == this->bucketCount) {
    dst = AllocateEntries(this,newSize,true);
    Memory::
    CopyArray<JsUtil::WeakRefValueDictionaryEntry<Js::JavascriptLibrary::JsrtExternalCallbacks,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>>,Memory::RecyclerNonLeafAllocator>
              (dst,(long)(int)newSize,(this->entries).ptr,(long)this->count);
    DeleteEntries(this,(this->entries).ptr,this->size);
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr = dst;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->size = newSize;
    this->modFunctionIndex = 0x4b;
  }
  else {
    Allocate(this,&local_40.ptr,(EntryType **)&newBuckets,bucketCount,newSize);
    Memory::
    CopyArray<JsUtil::WeakRefValueDictionaryEntry<Js::JavascriptLibrary::JsrtExternalCallbacks,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>>>,Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>>,Memory::RecyclerNonLeafAllocator>
              ((WeakRefValueDictionaryEntry<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
                *)newBuckets,(long)(int)newSize,(this->entries).ptr,(long)this->count);
    this->modFunctionIndex = 0x4b;
    iVar7 = this->count;
    if (0 < iVar7) {
      lVar8 = 0;
      lVar9 = 0;
      piVar6 = newBuckets;
      do {
        if (-2 < *(int *)((long)piVar6 + lVar8 + 8)) {
          uVar4 = GetBucket((*(uint *)((long)piVar6 + lVar8 + 0x18) ^
                             *(uint *)((long)piVar6 + lVar8 + 0x10) ^
                            *(uint *)((long)piVar6 + lVar8 + 0x20)) * 2 + 1,bucketCount,
                            this->modFunctionIndex);
          *(int *)((long)newBuckets + lVar8 + 8) = local_40.ptr[(int)uVar4];
          local_40.ptr[(int)uVar4] = (int)lVar9;
          iVar7 = this->count;
          piVar6 = newBuckets;
        }
        lVar9 = lVar9 + 1;
        lVar8 = lVar8 + 0x28;
      } while (lVar9 < iVar7);
    }
    DeleteBuckets(this,(this->buckets).ptr,this->bucketCount);
    DeleteEntries(this,(this->entries).ptr,this->size);
    if (this->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Resize(this->stats,newSize,newSize - this->size);
    }
    TVar2.ptr = local_40.ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buckets).ptr = TVar2.ptr;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    piVar6 = newBuckets;
    Memory::Recycler::WBSetBit((char *)&this->entries);
    (this->entries).ptr =
         (WeakRefValueDictionaryEntry<Js::JavascriptLibrary::JsrtExternalCallbacks,_Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicType>_>_>
          *)piVar6;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->entries);
    this->bucketCount = bucketCount;
    this->size = newSize;
  }
  return;
}

Assistant:

void Resize()
        {
            AutoDoResize autoDoResize(*this);

            int newSize = SizePolicy::GetNextSize(count);
            int modIndex = UNKNOWN_MOD_INDEX;
            uint newBucketCount = SizePolicy::GetBucketSize(newSize, &modIndex);

            __analysis_assume(newSize > count);
            int* newBuckets = nullptr;
            EntryType* newEntries = nullptr;
            if (newBucketCount == bucketCount)
            {
                // no need to rehash
                newEntries = AllocateEntries(newSize);
                CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                    newEntries, newSize, entries, count);

                DeleteEntries(entries, size);

                this->entries = newEntries;
                this->size = newSize;
                this->modFunctionIndex = modIndex;
                return;
            }

            Allocate(&newBuckets, &newEntries, newBucketCount, newSize);
            CopyArray<EntryType, Field(ValueType, TAllocator), TAllocator>(
                newEntries, newSize, entries, count);

            // When TAllocator is of type Recycler, it is possible that the Allocate above causes a collection, which
            // in turn can cause entries in the dictionary to be removed - i.e. the dictionary contains weak references
            // that remove themselves when no longer valid. This means the free list might not be empty anymore.
            this->modFunctionIndex = modIndex;
            for (int i = 0; i < count; i++)
            {
                __analysis_assume(i < newSize);

                if (!IsFreeEntry(newEntries[i]))
                {
                    hash_t hashCode = newEntries[i].template GetHashCode<Comparer<TKey>>();
                    int bucket = GetBucket(hashCode, newBucketCount, modFunctionIndex);
                    newEntries[i].next = newBuckets[bucket];
                    newBuckets[bucket] = i;
                }
            }

            DeleteBuckets(buckets, bucketCount);
            DeleteEntries(entries, size);

#if PROFILE_DICTIONARY
            if (stats)
                stats->Resize(newSize, /*emptyBuckets=*/ newSize - size);
#endif
            this->buckets = newBuckets;
            this->entries = newEntries;
            bucketCount = newBucketCount;
            size = newSize;
        }